

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfPreviewImageAttribute.cpp
# Opt level: O2

void __thiscall
Imf_3_4::TypedAttribute<Imf_3_4::PreviewImage>::readValueFrom
          (TypedAttribute<Imf_3_4::PreviewImage> *this,IStream *is,int size,int version)

{
  uint uVar1;
  InputExc *this_00;
  undefined4 in_register_0000000c;
  ulong uVar2;
  long lVar3;
  PreviewRgba *pPVar4;
  bool bVar5;
  PreviewImage p;
  
  (*is->_vptr_IStream[3])(is,&p,4,CONCAT44(in_register_0000000c,version));
  uVar1 = p._width;
  lVar3 = (long)(int)p._width;
  (*is->_vptr_IStream[3])(is,&p,4);
  if (-1 < lVar3) {
    if (-1 < (int)p._width) {
      if (lVar3 * (ulong)p._width * 4 + 8 == (long)size) {
        PreviewImage::PreviewImage(&p,uVar1,p._width,(PreviewRgba *)0x0);
        uVar1 = p._height * p._width;
        if ((int)(p._height * p._width) < 1) {
          uVar1 = 0;
        }
        uVar2 = (ulong)uVar1;
        pPVar4 = p._pixels;
        while (bVar5 = uVar2 != 0, uVar2 = uVar2 - 1, bVar5) {
          (*is->_vptr_IStream[3])(is,pPVar4,1);
          (*is->_vptr_IStream[3])(is,&pPVar4->g,1);
          (*is->_vptr_IStream[3])(is,&pPVar4->b,1);
          (*is->_vptr_IStream[3])(is,&pPVar4->a,1);
          pPVar4 = pPVar4 + 1;
        }
        PreviewImage::operator=(&this->_value,&p);
        PreviewImage::~PreviewImage(&p);
        return;
      }
      this_00 = (InputExc *)__cxa_allocate_exception(0x48);
      Iex_3_4::InputExc::InputExc
                (this_00,"Mismatch between Preview Image Attribute size and dimensions");
      goto LAB_00192588;
    }
  }
  this_00 = (InputExc *)__cxa_allocate_exception(0x48);
  Iex_3_4::InputExc::InputExc(this_00,"Invalid dimensions in Preview Image Attribute");
LAB_00192588:
  __cxa_throw(this_00,&Iex_3_4::InputExc::typeinfo,Iex_3_4::InputExc::~InputExc);
}

Assistant:

IMF_EXPORT void
PreviewImageAttribute::readValueFrom (
    OPENEXR_IMF_INTERNAL_NAMESPACE::IStream& is, int size, int version)
{
    int width, height;

    Xdr::read<StreamIO> (is, width);
    Xdr::read<StreamIO> (is, height);

    if (width < 0 || height < 0)
    {
        throw IEX_NAMESPACE::InputExc (
            "Invalid dimensions in Preview Image Attribute");
    }

    // total attribute size should be four bytes per pixel + 8 bytes for width and height dimensions
    if (static_cast<uint64_t> (width) * static_cast<uint64_t> (height) * 4l +
            8l !=
        static_cast<uint64_t> (size))
    {
        throw IEX_NAMESPACE::InputExc (
            "Mismatch between Preview Image Attribute size and dimensions");
    }

    PreviewImage p (width, height);

    int          numPixels = p.width () * p.height ();
    PreviewRgba* pixels    = p.pixels ();

    for (int i = 0; i < numPixels; ++i)
    {
        Xdr::read<StreamIO> (is, pixels[i].r);
        Xdr::read<StreamIO> (is, pixels[i].g);
        Xdr::read<StreamIO> (is, pixels[i].b);
        Xdr::read<StreamIO> (is, pixels[i].a);
    }

    _value = p;
}